

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

void RigidBodyDynamics::CalcPointJacobian
               (Model *model,VectorNd *Q,uint body_id,Vector3d *point_position,MatrixNd *G,
               bool update_kinematics)

{
  uint uVar1;
  pointer pJVar2;
  pointer ppCVar3;
  bool bVar4;
  undefined7 in_register_00000089;
  double dVar5;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> local_2e8;
  Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false>
  local_2a8;
  SpatialTransform local_278;
  SpatialTransform local_218;
  SpatialTransform local_1b8;
  SpatialMatrix local_158;
  
  if ((int)CONCAT71(in_register_00000089,update_kinematics) != 0) {
    UpdateKinematicsCustom(model,Q,(VectorNd *)0x0,(VectorNd *)0x0);
  }
  CalcBodyToBaseCoordinates(&local_1b8.r,model,Q,body_id,point_position,false);
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[0] = 1.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[3] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[1] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[2] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[4] = 1.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[5] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[6] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[7] = 0.0;
  local_1b8.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
  m_data.array[8] = 1.0;
  bVar4 = Model::IsFixedBodyId(model,body_id);
  if (bVar4) {
    body_id = (model->mFixedBodies).
              super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              .
              super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ._M_impl.super__Vector_impl_data._M_start[body_id - model->fixed_body_discriminator].
              mMovableParent;
  }
  for (; body_id != 0;
      body_id = (model->lambda).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start[body_id]) {
    pJVar2 = (model->mJoints).
             super_vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             .
             super__Vector_base<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar5 = (double)(ulong)pJVar2[body_id].q_index;
    if (pJVar2[body_id].mJointType == JointTypeCustom) {
      uVar1 = pJVar2[body_id].custom_joint_index;
      Math::SpatialTransform::inverse
                (&local_218,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + body_id);
      Math::SpatialTransform::operator*(&local_278,&local_1b8,&local_218);
      Math::SpatialTransform::toMatrix(&local_158,&local_278);
      ppCVar3 = (model->mCustomJoints).
                super__Vector_base<RigidBodyDynamics::CustomJoint_*,_std::allocator<RigidBodyDynamics::CustomJoint_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_xpr.m_rhs = (RhsNested)ppCVar3[uVar1];
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_blockCols.m_value =
           (long)*(uint *)((long)local_2a8.
                                 super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
                                 .
                                 super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
                                 .m_xpr.m_rhs + 8);
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_xpr.m_rhs = (RhsNested)
                     ((long)local_2a8.
                            super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
                            .
                            super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
                            .m_xpr.m_rhs + 0x70);
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_startRow.m_value = 3;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_startCol.m_value = 0;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_blockRows.m_value = 3;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride =
           (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             + local_2e8.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_outerStride * (long)dVar5;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = (long)*(uint *)(ppCVar3[uVar1] + 8);
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = 0;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr = G
      ;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startCol.m_value = (long)dVar5;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_xpr.m_lhs = &local_158.super_Matrix<double,_6,_6,_0,_6,_6>;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>const,_1,_1,false>>
                (&local_2e8,&local_2a8);
    }
    else if (pJVar2[body_id].mDoFCount == 3) {
      Math::SpatialTransform::inverse
                (&local_218,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + body_id);
      Math::SpatialTransform::operator*(&local_278,&local_1b8,&local_218);
      Math::SpatialTransform::toMatrix(&local_158,&local_278);
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_xpr.m_rhs = (RhsNested)
                     ((model->multdof3_S).
                      super_vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      .
                      super__Vector_base<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + body_id);
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_startRow.m_value = 3;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_startCol.m_value = 0;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_outerStride =
           (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data
           = (G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             + (long)dVar5 *
               local_2e8.
               super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
               .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
               .m_outerStride;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows
      .m_value = 3;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols
      .m_value = 3;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startRow.m_value = 0;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr = G
      ;
      local_2e8.
      super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
      m_startCol.m_value = (long)dVar5;
      local_2a8.
      super_BlockImpl<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_Eigen::Dense>
      .
      super_BlockImpl_dense<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,__1,__1,_false,_false>
      .m_xpr.m_lhs = &local_158.super_Matrix<double,_6,_6,_0,_6,_6>;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Product<Eigen::Matrix<double,6,6,0,6,6>,Eigen::Matrix<double,6,3,0,6,3>,0>const,3,3,false>>
                (&local_2e8,
                 (Block<const_Eigen::Product<Eigen::Matrix<double,_6,_6,_0,_6,_6>,_Eigen::Matrix<double,_6,_3,_0,_6,_3>,_0>,_3,_3,_false>
                  *)&local_2a8);
    }
    else if (pJVar2[body_id].mDoFCount == 1) {
      Math::SpatialTransform::inverse
                ((SpatialTransform *)&local_158,
                 (model->X_base).
                 super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 .
                 super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                 ._M_impl.super__Vector_impl_data._M_start + body_id);
      Math::SpatialTransform::apply
                ((SpatialTransform *)&local_158,
                 (model->S).
                 super_vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 super__Vector_base<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>.
                 _M_impl.super__Vector_impl_data._M_start + body_id);
      Math::SpatialTransform::apply(&local_1b8,(SpatialVector *)&local_2a8);
      local_218.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (double)&local_2e8.
                    super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                    .
                    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                    .m_xpr;
      local_218.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = 1.48219693752374e-323;
      local_218.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = 2.96439387504748e-323;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[6] =
           (double)(G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                   m_rows;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (double)((G->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_data + (long)dVar5 *
                             (long)local_278.E.super_Matrix3d.
                                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data.array[6]);
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[1] = 1.48219693752374e-323;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = 4.94065645841247e-324;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[4] = 0.0;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[3] = (double)G;
      local_278.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[5] = dVar5;
      local_218.E.super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[2] = (double)&local_2e8;
      Eigen::internal::
      call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,6,1,0,6,1>,3,1,false>>
                ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)&local_278,
                 (Block<Eigen::Matrix<double,_6,_1,_0,_6,_1>,_3,_1,_false> *)&local_218);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI void CalcPointJacobian (
    Model &model,
    const VectorNd &Q,
    unsigned int body_id,
    const Vector3d &point_position,
    MatrixNd &G,
    bool update_kinematics) {
  LOG << "-------- " << __func__ << " --------" << std::endl;

  // update the Kinematics if necessary
  if (update_kinematics) {
    UpdateKinematicsCustom (model, &Q, NULL, NULL);
  }

  SpatialTransform point_trans = 
    SpatialTransform (Matrix3d::Identity(), 
        CalcBodyToBaseCoordinates ( model, 
          Q, 
          body_id,
          point_position, 
          false));

  assert (G.rows() == 3 && G.cols() == model.qdot_size );

  unsigned int reference_body_id = body_id;

  if (model.IsFixedBodyId(body_id)) {
    unsigned int fbody_id = body_id - model.fixed_body_discriminator;
    reference_body_id = model.mFixedBodies[fbody_id].mMovableParent;
  }

  unsigned int j = reference_body_id;

  // e[j] is set to 1 if joint j contributes to the jacobian that we are
  // computing. For all other joints the column will be zero.
  while (j != 0) {
    unsigned int q_index = model.mJoints[j].q_index;

    if(model.mJoints[j].mJointType != JointTypeCustom){
      if (model.mJoints[j].mDoFCount == 1) {
        G.block(0,q_index, 3, 1) =
          point_trans.apply(
              model.X_base[j].inverse().apply(
                model.S[j])).block<3, 1>(3,0);
      } else if (model.mJoints[j].mDoFCount == 3) {
        G.block(0, q_index, 3, 3) =
          ((point_trans
            * model.X_base[j].inverse()).toMatrix()
           * model.multdof3_S[j]).block<3, 3>(3,0);
      }
    } else {
      unsigned int k = model.mJoints[j].custom_joint_index;

      G.block(0, q_index, 3, model.mCustomJoints[k]->mDoFCount) =
        ((point_trans
          * model.X_base[j].inverse()).toMatrix()
         * model.mCustomJoints[k]->S).block( 
           3,0,3,model.mCustomJoints[k]->mDoFCount);
    }

    j = model.lambda[j];
  }
}